

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O0

PatternList *
parse_seq(PatternList *__return_storage_ptr__,Tokens *tokens,
         vector<docopt::Option,_std::allocator<docopt::Option>_> *options)

{
  bool bVar1;
  string *__lhs;
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  __result;
  string local_88;
  undefined1 local_68 [24];
  PatternList atom;
  string *token;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *options_local;
  Tokens *tokens_local;
  PatternList *ret;
  
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::vector(__return_storage_ptr__);
  while( true ) {
    bVar1 = Tokens::operator_cast_to_bool(tokens);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    atom.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)Tokens::current_abi_cxx11_(tokens)
    ;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            atom.
                            super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,"]");
    if (bVar1) {
      return __return_storage_ptr__;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            atom.
                            super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,")");
    if (bVar1) {
      return __return_storage_ptr__;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            atom.
                            super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,"|");
    if (bVar1) break;
    parse_atom((PatternList *)(local_68 + 0x10),tokens,options);
    __lhs = Tokens::current_abi_cxx11_(tokens);
    bVar1 = std::operator==(__lhs,"...");
    if (bVar1) {
      std::
      make_shared<docopt::OneOrMore,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                ((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  *)local_68);
      std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
      ::emplace_back<std::shared_ptr<docopt::OneOrMore>>
                ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                  *)__return_storage_ptr__,(shared_ptr<docopt::OneOrMore> *)local_68);
      std::shared_ptr<docopt::OneOrMore>::~shared_ptr((shared_ptr<docopt::OneOrMore> *)local_68);
      Tokens::pop_abi_cxx11_(&local_88,tokens);
      std::__cxx11::string::~string((string *)&local_88);
    }
    else {
      __first = std::
                vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ::begin((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                         *)(local_68 + 0x10));
      __last = std::
               vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ::end((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      *)(local_68 + 0x10));
      __result = std::
                 back_inserter<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                           (__return_storage_ptr__);
      std::
      move<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>,std::back_insert_iterator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                ((__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                  )__first._M_current,
                 (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                  )__last._M_current,__result);
    }
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)(local_68 + 0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

static PatternList parse_seq(Tokens& tokens, std::vector<Option>& options)
{
	// seq ::= ( atom [ '...' ] )* ;"""

	PatternList ret;

	while (tokens) {
		auto const& token = tokens.current();

		if (token=="]" || token==")" || token=="|")
			break;

		auto atom = parse_atom(tokens, options);
		if (tokens.current() == "...") {
			ret.emplace_back(std::make_shared<OneOrMore>(std::move(atom)));
			tokens.pop();
		} else {
			std::move(atom.begin(), atom.end(), std::back_inserter(ret));
		}
	}

	return ret;
}